

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BufferSource.hpp
# Opt level: O2

void __thiscall
Outputs::Speaker::SampleSource<GI::AY38910::AY38910<true>,_true,_4>::
apply_samples<(Outputs::Speaker::Action)0>
          (SampleSource<GI::AY38910::AY38910<true>,_true,_4> *this,size_t number_of_samples,
          type *target)

{
  AY38910SampleSource<true> *this_00;
  int iVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  type level;
  undefined4 local_50;
  type local_4c;
  undefined4 local_38;
  
  this_00 = (AY38910SampleSource<true> *)(this + -0x454);
  GI::AY38910::AY38910SampleSource<true>::level(this_00);
  iVar1 = this->master_divider_;
  lVar4 = 0;
  uVar5 = 0;
  while ((uVar5 <= number_of_samples && number_of_samples - uVar5 != 0 && (iVar1 != 4))) {
    target[uVar5] = local_4c;
    uVar5 = uVar5 + 1;
    iVar1 = this->master_divider_ + 1;
    this->master_divider_ = iVar1;
    lVar4 = lVar4 + -4;
  }
  GI::AY38910::AY38910SampleSource<true>::advance(this_00);
  uVar6 = number_of_samples - uVar5 >> 2;
  lVar3 = (long)target - lVar4;
  lVar4 = -lVar4;
  while (iVar1 = (int)uVar6, uVar6 = (ulong)(iVar1 - 1), iVar1 != 0) {
    uVar5 = uVar5 + 4;
    GI::AY38910::AY38910SampleSource<true>::level(this_00);
    for (lVar2 = 0; lVar2 != 0x10; lVar2 = lVar2 + 4) {
      *(undefined4 *)(lVar3 + lVar2) = local_50;
    }
    GI::AY38910::AY38910SampleSource<true>::advance(this_00);
    lVar4 = lVar4 + 0x10;
    lVar3 = lVar3 + 0x10;
  }
  GI::AY38910::AY38910SampleSource<true>::level(this_00);
  this->master_divider_ = (int)number_of_samples - (int)uVar5;
  GI::AY38910::AY38910SampleSource<true>::level(this_00);
  for (; number_of_samples << 2 != lVar4; lVar4 = lVar4 + 4) {
    *(undefined4 *)((long)&target->left + lVar4) = local_38;
  }
  return;
}

Assistant:

void apply_samples(std::size_t number_of_samples, typename SampleT<stereo>::type *target) {
			auto &source = *static_cast<SourceT *>(this);

			if constexpr (divider == 1) {
				while(number_of_samples--) {
					apply<action>(*target, source.level());
					++target;
					source.advance();
				}
			} else {
				std::size_t c = 0;

				// Fill in the tail of any partially-captured level.
				auto level = source.level();
				while(c < number_of_samples && master_divider_ != divider) {
					apply<action>(target[c], level);
					++c;
					++master_divider_;
				}
				source.advance();

				// Provide all full levels.
				auto whole_steps = static_cast<int>((number_of_samples - c) / divider);
				while(whole_steps--) {
					fill<action>(&target[c], &target[c + divider], source.level());
					c += divider;
					source.advance();
				}

				// Provide the head of a further partial capture.
				level = source.level();
				master_divider_ = static_cast<int>(number_of_samples - c);
				fill<action>(&target[c], &target[number_of_samples], source.level());
			}
		}